

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

void join_regions(chunk *c,int *colors,int *counts,_Bool allow_vault_disconnect)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = c->width * c->height;
  if (0 < (int)uVar3) {
    uVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (0 < counts[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    if (1 < uVar4) {
      do {
        uVar2 = 0xffffffff;
        if (0 < (int)uVar3) {
          uVar2 = 0;
          do {
            if (0 < counts[uVar2]) goto LAB_00149497;
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
          uVar2 = 0xffffffff;
        }
LAB_00149497:
        join_region(c,colors,counts,(wchar_t)uVar2,L'\xffffffff',allow_vault_disconnect);
        bVar1 = 2 < (int)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

static void join_regions(struct chunk *c, int colors[], int counts[],
		bool allow_vault_disconnect) {
	int h = c->height;
	int w = c->width;
	int size = h * w;
	int num = count_colors(counts, size);

	/* While we have multiple colors (i.e. disconnected regions), join one
	 * of the regions to another one.
	 */
	while (num > 1) {
		int color = first_color(counts, size);
		join_region(c, colors, counts, color, -1,
			allow_vault_disconnect);
		num--;
	}
}